

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

pair<double,_unsigned_long> __thiscall
duckdb::BlockingSample::PopFromWeightQueue(BlockingSample *this)

{
  pointer ppVar1;
  pair<double,_unsigned_long> pVar2;
  pointer pBVar3;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  
  this_00 = &this->base_reservoir_sample;
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pVar2 = *(pBVar3->reservoir_weights).c.
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  ::std::
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  ::pop(&pBVar3->reservoir_weights);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  ppVar1 = (pBVar3->reservoir_weights).c.
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 == (pBVar3->reservoir_weights).c.
                super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar3->min_weight_threshold = 1.0;
  }
  else {
    pBVar3->min_weight_threshold = -ppVar1->first;
    pBVar3->min_weighted_entry_index = ppVar1->second;
  }
  return pVar2;
}

Assistant:

std::pair<double, idx_t> BlockingSample::PopFromWeightQueue() {
	D_ASSERT(base_reservoir_sample && !base_reservoir_sample->reservoir_weights.empty());
	auto ret = base_reservoir_sample->reservoir_weights.top();
	base_reservoir_sample->reservoir_weights.pop();

	base_reservoir_sample->UpdateMinWeightThreshold();
	D_ASSERT(base_reservoir_sample->min_weight_threshold > 0);
	return ret;
}